

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  int iVar1;
  IdList_item *pIVar2;
  IdList *p_00;
  IdList_item *pIVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  if ((p != (IdList *)0x0) &&
     (p_00 = (IdList *)sqlite3DbMallocRawNN(db,0x10), p_00 != (IdList *)0x0)) {
    iVar1 = p->nId;
    p_00->nId = iVar1;
    pIVar3 = (IdList_item *)sqlite3DbMallocRawNN(db,(long)iVar1 << 4);
    p_00->a = pIVar3;
    if (pIVar3 != (IdList_item *)0x0) {
      lVar5 = 8;
      for (lVar6 = 0; lVar6 < p->nId; lVar6 = lVar6 + 1) {
        pIVar3 = p_00->a;
        pIVar2 = p->a;
        pcVar4 = sqlite3DbStrDup(db,*(char **)((long)pIVar2 + lVar5 + -8));
        *(char **)((long)pIVar3 + lVar5 + -8) = pcVar4;
        *(undefined4 *)((long)&pIVar3->zName + lVar5) =
             *(undefined4 *)((long)&pIVar2->zName + lVar5);
        lVar5 = lVar5 + 0x10;
      }
      return p_00;
    }
    sqlite3DbFreeNN(db,p_00);
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->a = sqlite3DbMallocRawNN(db, p->nId*sizeof(p->a[0]) );
  if( pNew->a==0 ){
    sqlite3DbFreeNN(db, pNew);
    return 0;
  }
  /* Note that because the size of the allocation for p->a[] is not
  ** necessarily a power of two, sqlite3IdListAppend() may not be called
  ** on the duplicate created by this function. */
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->idx = pOldItem->idx;
  }
  return pNew;
}